

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_mul_v_s128_129(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  int iVar1;
  long lVar2;
  mzd_local_t *pmVar3;
  word *vptr;
  uint i;
  int iVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  word128 cval [4];
  
  lVar2 = 0;
  cval[0][0] = 0;
  cval[0][1] = 0;
  cval[1][0] = 0;
  cval[1][1] = 0;
  cval[2][0] = 0;
  cval[2][1] = 0;
  cval[3][0] = 0;
  cval[3][1] = 0;
  auVar6._8_8_ = v->w64[0];
  auVar6._0_8_ = v->w64[0];
  auVar6 = vpsraq_avx512vl(auVar6,0x3f);
  for (; lVar2 != 0x20; lVar2 = lVar2 + 0x10) {
    auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A[0x3f].w64 + lVar2),auVar6,
                                 *(undefined1 (*) [16])((long)cval[0] + lVar2),0x6a);
    *(undefined1 (*) [16])((long)cval[0] + lVar2) = auVar7;
  }
  pmVar3 = A + 0x40;
  iVar1 = 2;
  while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
    for (iVar4 = 0x40; iVar4 != 0; iVar4 = iVar4 + -2) {
      auVar6 = vpbroadcastq_avx512vl();
      for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 0x10) {
        auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)pmVar3->w64 + lVar2),auVar6,
                                     *(undefined1 (*) [16])((long)cval[0] + lVar2),0x6a);
        *(undefined1 (*) [16])((long)cval[0] + lVar2) = auVar7;
      }
      auVar6 = vpbroadcastq_avx512vl();
      lVar2 = 0x20;
      auVar6 = vpsllq_avx(auVar6,0x3e);
      auVar6 = vpsraq_avx512vl(auVar6,0x3f);
      for (; lVar2 != 0x40; lVar2 = lVar2 + 0x10) {
        auVar7 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)pmVar3->w64 + lVar2),auVar6,
                                     *(undefined1 (*) [16])((long)cval[0] + lVar2),0x6a);
        *(undefined1 (*) [16])((long)cval[0] + lVar2) = auVar7;
      }
      pmVar3 = pmVar3 + 2;
    }
  }
  *(uint *)c->w64 = (uint)cval[2][0] ^ (uint)cval[0][0];
  *(uint *)((long)c->w64 + 4) = cval[2][0]._4_4_ ^ cval[0][0]._4_4_;
  *(uint *)(c->w64 + 1) = (uint)cval[2][1] ^ (uint)cval[0][1];
  *(uint *)((long)c->w64 + 0xc) = cval[2][1]._4_4_ ^ cval[0][1]._4_4_;
  *(uint *)(c->w64 + 2) = (uint)cval[3][0] ^ (uint)cval[1][0];
  *(uint *)((long)c->w64 + 0x14) = cval[3][0]._4_4_ ^ cval[1][0]._4_4_;
  *(uint *)(c->w64 + 3) = (uint)cval[3][1] ^ (uint)cval[1][1];
  *(uint *)((long)c->w64 + 0x1c) = cval[3][1]._4_4_ ^ cval[1][1]._4_4_;
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_mul_v_s128_129(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word128 cval[4] = {mm128_zero, mm128_zero, mm128_zero, mm128_zero};
  {
    Ablock += 63;
    word idx = (*vptr) >> 63;
    mm128_xor_mask_region(&cval[0], Ablock[0].w64, mm128_compute_mask(idx, 0), 2);
    vptr++;
    Ablock++;
  }
  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 2, idx >>= 2, Ablock += 2) {
      mm128_xor_mask_region(&cval[0], Ablock[0].w64, mm128_compute_mask(idx, 0), 2);
      mm128_xor_mask_region(&cval[2], Ablock[1].w64, mm128_compute_mask(idx, 1), 2);
    }
  }
  mm128_store(&cblock->w64[0], mm128_xor(cval[0], cval[2]));
  mm128_store(&cblock->w64[2], mm128_xor(cval[1], cval[3]));
}